

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockExpectedCallTest.cpp
# Opt level: O1

void __thiscall
TEST_MockExpectedCall_callOrderIsFulfilledSingle_Test::testBody
          (TEST_MockExpectedCall_callOrderIsFulfilledSingle_Test *this)

{
  MockCheckedExpectedCall *pMVar1;
  uint uVar2;
  int iVar3;
  UtestShell *pUVar4;
  TestTerminator *pTVar5;
  SimpleString local_30;
  
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMockExpectedCall).call;
  SimpleString::SimpleString(&local_30,"name");
  (*(pMVar1->super_MockExpectedCall)._vptr_MockExpectedCall[2])(pMVar1,&local_30);
  SimpleString::~SimpleString(&local_30);
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMockExpectedCall).call;
  (*(pMVar1->super_MockExpectedCall)._vptr_MockExpectedCall[3])(pMVar1,1);
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMockExpectedCall).call;
  (*(pMVar1->super_MockExpectedCall)._vptr_MockExpectedCall[0x36])(pMVar1,1);
  pUVar4 = UtestShell::getCurrent();
  uVar2 = (*(((this->super_TEST_GROUP_CppUTestGroupMockExpectedCall).call)->super_MockExpectedCall).
            _vptr_MockExpectedCall[0x30])();
  pTVar5 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[8])
            (pUVar4,(ulong)(uVar2 & 0xff),"CHECK","call->isFulfilled()",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockExpectedCallTest.cpp"
             ,0x2b9,pTVar5);
  pUVar4 = UtestShell::getCurrent();
  iVar3 = (*(((this->super_TEST_GROUP_CppUTestGroupMockExpectedCall).call)->super_MockExpectedCall).
            _vptr_MockExpectedCall[0x35])();
  pTVar5 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[8])
            (pUVar4,(ulong)(byte)((byte)iVar3 ^ 1),"CHECK_FALSE","call->isOutOfOrder()",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockExpectedCallTest.cpp"
             ,0x2ba,pTVar5);
  return;
}

Assistant:

TEST(MockExpectedCall, callOrderIsFulfilledSingle)
{
    call->withName("name");
    call->withCallOrder(1);
    call->callWasMade(1);
    CHECK(call->isFulfilled());
    CHECK_FALSE(call->isOutOfOrder());
}